

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O2

void __thiscall MessageQueue::~MessageQueue(MessageQueue *this)

{
  MessageThread *this_00;
  
  this_00 = (this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (MessageThread *)0x0) {
    MessageThread::stop(this_00);
    Thread::join(&((this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_Thread);
    std::__shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>);
  }
  if ((this->queue != -1) && (this->owner == true)) {
    msgctl(this->queue,0,(msqid_ds *)0x0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(const_Buffer_&)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(const_Buffer_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_Buffer_&)>_>_>_>
  ::~_Rb_tree(&(this->signalDataAvailable).connections._M_t);
  return;
}

Assistant:

MessageQueue::~MessageQueue()
{
    if (thread) {
        thread->stop();
        thread->join();
        thread.reset();
    }
    if (queue != -1 && owner) {
        msgctl(queue, IPC_RMID, 0);
    }
}